

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void ReadVars(PNGHandle *png,SDWORD *vars,size_t count,DWORD id)

{
  uint uVar1;
  FILE *file;
  undefined1 local_348 [8];
  FPNGChunkArchive arc;
  size_t i;
  ulong uStack_38;
  DWORD var;
  size_t used;
  size_t len;
  size_t sStack_20;
  DWORD id_local;
  size_t count_local;
  SDWORD *vars_local;
  PNGHandle *png_local;
  
  len._4_4_ = id;
  sStack_20 = count;
  count_local = (size_t)vars;
  vars_local = (SDWORD *)png;
  uVar1 = M_FindPNGChunk(png,id);
  used = (size_t)uVar1;
  uStack_38 = 0;
  if (used != 0) {
    file = FileReader::GetFile(*(FileReader **)vars_local);
    FPNGChunkArchive::FPNGChunkArchive((FPNGChunkArchive *)local_348,file,len._4_4_,used);
    uStack_38 = used >> 2;
    arc.Chunk.m_ChunkID = 0;
    arc.Chunk._52_4_ = 0;
    for (; (ulong)arc.Chunk._48_8_ < uStack_38; arc.Chunk._48_8_ = arc.Chunk._48_8_ + 1) {
      FArchive::operator<<((FArchive *)local_348,(DWORD *)((long)&i + 4));
      *(undefined4 *)(count_local + arc.Chunk._48_8_ * 4) = i._4_4_;
    }
    FileReader::ResetFilePtr(*(FileReader **)vars_local);
    FPNGChunkArchive::~FPNGChunkArchive((FPNGChunkArchive *)local_348);
  }
  if (uStack_38 < sStack_20) {
    memset((void *)(count_local + uStack_38 * 4),0,(sStack_20 - uStack_38) * 4);
  }
  return;
}

Assistant:

static void ReadVars (PNGHandle *png, SDWORD *vars, size_t count, DWORD id)
{
	size_t len = M_FindPNGChunk (png, id);
	size_t used = 0;

	if (len != 0)
	{
		DWORD var;
		size_t i;
		FPNGChunkArchive arc (png->File->GetFile(), id, len);
		used = len / 4;

		for (i = 0; i < used; ++i)
		{
			arc << var;
			vars[i] = var;
		}
		png->File->ResetFilePtr();
	}
	if (used < count)
	{
		memset (&vars[used], 0, (count-used)*4);
	}
}